

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_del_nolock_(event *ev,int blocking)

{
  event_base *base_00;
  unsigned_long uVar1;
  int iVar2;
  event_callback *peVar3;
  unsigned_long uVar4;
  event_callback *peVar5;
  bool bVar6;
  int local_2c;
  int notify;
  int res;
  event_base *base;
  int blocking_local;
  event *ev_local;
  
  local_2c = 0;
  bVar6 = false;
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_del: %p (fd %d), callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (ev->ev_base == (event_base *)0x0) {
    ev_local._4_4_ = -1;
  }
  else {
    if (((ev->ev_base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
       (iVar2 = evthread_is_debug_lock_held_(ev->ev_base->th_base_lock), iVar2 == 0)) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xb09,"evthread_is_debug_lock_held_((ev->ev_base)->th_base_lock)",
                 "event_del_nolock_");
    }
    if ((blocking == 3) || (((ev->ev_evcallback).evcb_flags & 0x40U) == 0)) {
      base_00 = ev->ev_base;
      if (((ev->ev_evcallback).evcb_flags & 0xff00U) != 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xb14,"!(ev->ev_flags & ~EVLIST_ALL)","event_del_nolock_");
      }
      if ((((ev->ev_events & 8U) != 0) && ((ev->ev_).ev_signal.ev_ncalls != 0)) &&
         ((ev->ev_).ev_io.ev_timeout.tv_usec != 0)) {
        *(ev->ev_).ev_signal.ev_pncalls = 0;
      }
      if (((ev->ev_evcallback).evcb_flags & 1U) != 0) {
        event_queue_remove_timeout(base_00,ev);
      }
      if (((ev->ev_evcallback).evcb_flags & 8U) == 0) {
        if (((ev->ev_evcallback).evcb_flags & 0x20U) != 0) {
          peVar3 = event_to_event_callback(ev);
          event_queue_remove_active_later(base_00,peVar3);
        }
      }
      else {
        peVar3 = event_to_event_callback(ev);
        event_queue_remove_active(base_00,peVar3);
      }
      if (((ev->ev_evcallback).evcb_flags & 2U) != 0) {
        event_queue_remove_inserted(base_00,ev);
        if ((ev->ev_events & 0x86U) == 0) {
          local_2c = evmap_signal_del_(base_00,ev->ev_fd,ev);
        }
        else {
          local_2c = evmap_io_del_(base_00,ev->ev_fd,ev);
        }
        bVar6 = local_2c == 1;
        if (bVar6) {
          local_2c = 0;
        }
        iVar2 = event_haveevents(base_00);
        if ((iVar2 == 0) && (base_00->event_count_active == 0)) {
          bVar6 = true;
        }
      }
      if ((((local_2c != -1) && (bVar6)) && (evthread_id_fn_ != (_func_unsigned_long *)0x0)) &&
         ((base_00->running_loop != 0 &&
          (uVar1 = base_00->th_owner_id, uVar4 = (*evthread_id_fn_)(), uVar1 != uVar4)))) {
        evthread_notify_base(base_00);
      }
      event_debug_note_del_(ev);
      if ((((blocking != 0) &&
           (peVar3 = base_00->current_event, peVar5 = event_to_event_callback(ev), peVar3 == peVar5)
           ) && ((evthread_id_fn_ != (_func_unsigned_long *)0x0 &&
                 (uVar1 = base_00->th_owner_id, uVar4 = (*evthread_id_fn_)(), uVar1 != uVar4)))) &&
         (((blocking == 1 || ((ev->ev_events & 0x40U) == 0)) &&
          (base_00->current_event_waiters = base_00->current_event_waiters + 1,
          base_00->current_event_cond != (void *)0x0)))) {
        (*evthread_cond_fns_.wait_condition)
                  (base_00->current_event_cond,base_00->th_base_lock,(timeval *)0x0);
      }
      ev_local._4_4_ = local_2c;
    }
    else {
      ev_local._4_4_ = 0;
    }
  }
  return ev_local._4_4_;
}

Assistant:

int
event_del_nolock_(struct event *ev, int blocking)
{
	struct event_base *base;
	int res = 0, notify = 0;

	event_debug(("event_del: %p (fd "EV_SOCK_FMT"), callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), ev->ev_callback));

	/* An event without a base has not been added */
	if (ev->ev_base == NULL)
		return (-1);

	EVENT_BASE_ASSERT_LOCKED(ev->ev_base);

	if (blocking != EVENT_DEL_EVEN_IF_FINALIZING) {
		if (ev->ev_flags & EVLIST_FINALIZING) {
			/* XXXX Debug */
			return 0;
		}
	}

	base = ev->ev_base;

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	/* See if we are just active executing this event in a loop */
	if (ev->ev_events & EV_SIGNAL) {
		if (ev->ev_ncalls && ev->ev_pncalls) {
			/* Abort loop */
			*ev->ev_pncalls = 0;
		}
	}

	if (ev->ev_flags & EVLIST_TIMEOUT) {
		/* NOTE: We never need to notify the main thread because of a
		 * deleted timeout event: all that could happen if we don't is
		 * that the dispatch loop might wake up too early.  But the
		 * point of notifying the main thread _is_ to wake up the
		 * dispatch loop early anyway, so we wouldn't gain anything by
		 * doing it.
		 */
		event_queue_remove_timeout(base, ev);
	}

	if (ev->ev_flags & EVLIST_ACTIVE)
		event_queue_remove_active(base, event_to_event_callback(ev));
	else if (ev->ev_flags & EVLIST_ACTIVE_LATER)
		event_queue_remove_active_later(base, event_to_event_callback(ev));

	if (ev->ev_flags & EVLIST_INSERTED) {
		event_queue_remove_inserted(base, ev);
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_del_(base, ev->ev_fd, ev);
		else
			res = evmap_signal_del_(base, (int)ev->ev_fd, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
		/* If we do not have events, let's notify event base so it can
		 * exit without waiting */
		if (!event_haveevents(base) && !N_ACTIVE_CALLBACKS(base))
			notify = 1;
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_del_(ev);

	/* If the main thread is currently executing this event's callback,
	 * and we are not the main thread, then we want to wait until the
	 * callback is done before returning. That way, when this function
	 * returns, it will be safe to free the user-supplied argument.
	 */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (blocking != EVENT_DEL_NOBLOCK &&
	    base->current_event == event_to_event_callback(ev) &&
	    !EVBASE_IN_THREAD(base) &&
	    (blocking == EVENT_DEL_BLOCK || !(ev->ev_events & EV_FINALIZE))) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	return (res);
}